

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O2

string<unsigned_long> __thiscall
irr::core::string<unsigned_long>::subString(string<unsigned_long> *this,s32 begin,s32 length)

{
  uint in_ECX;
  ulong uVar1;
  ulong extraout_RDX;
  undefined4 in_register_00000034;
  string<unsigned_long> sVar2;
  
  if ((int)in_ECX < 1) {
    string<char>(this,"");
    uVar1 = extraout_RDX;
  }
  else {
    string(this);
    reserve(this,in_ECX + 1);
    for (uVar1 = 0; in_ECX != uVar1; uVar1 = uVar1 + 1) {
      this->array[uVar1] =
           *(unsigned_long *)
            (*(long *)CONCAT44(in_register_00000034,begin) + (long)length * 8 + uVar1 * 8);
    }
    this->array[in_ECX] = 0;
    this->used = this->allocated;
  }
  sVar2.allocated = (int)uVar1;
  sVar2.used = (int)(uVar1 >> 0x20);
  sVar2.array = (unsigned_long *)this;
  return sVar2;
}

Assistant:

string<T> subString(s32 begin, s32 length)
	{
		if (length <= 0)
			return string<T>("");

		string<T> o;
		o.reserve(length+1);

		for (s32 i=0; i<length; ++i)
			o.array[i] = array[i+begin];

		o.array[length] = 0;
		o.used = o.allocated;

		return o;
	}